

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easing.cpp
# Opt level: O0

qreal easeOutInSine(qreal t)

{
  double in_XMM0_Qa;
  qreal qVar1;
  undefined8 local_8;
  
  if (0.5 <= in_XMM0_Qa) {
    qVar1 = easeInSine(in_XMM0_Qa);
    local_8 = qVar1 / 2.0 + 0.5;
  }
  else {
    qVar1 = easeOutSine(3.6598253620986e-317);
    local_8 = qVar1 / 2.0;
  }
  return local_8;
}

Assistant:

static qreal easeOutInSine(qreal t)
{
    if (t < 0.5) return easeOutSine (2*t)/2;
    return easeInSine(2*t - 1)/2 + 0.5;
}